

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

void __thiscall
icu_63::DataBuilderCollationIterator::DataBuilderCollationIterator
          (DataBuilderCollationIterator *this,CollationDataBuilder *b)

{
  Normalizer2Impl *pNVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  bool bVar7;
  long lVar6;
  
  (this->super_CollationIterator).trie = (this->builderData).trie;
  (this->super_CollationIterator).data = &this->builderData;
  uVar3 = 0;
  (this->super_CollationIterator).ceBuffer.length = 0;
  (this->super_CollationIterator).ceBuffer.buffer.ptr =
       (this->super_CollationIterator).ceBuffer.buffer.stackArray;
  (this->super_CollationIterator).ceBuffer.buffer.capacity = 0x28;
  (this->super_CollationIterator).ceBuffer.buffer.needToRelease = '\0';
  (this->super_CollationIterator).cesIndex = 0;
  (this->super_CollationIterator).skipped = (SkippedState *)0x0;
  (this->super_CollationIterator).numCpFwd = -1;
  (this->super_CollationIterator).isNumeric = '\0';
  (this->super_CollationIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__DataBuilderCollationIterator_003a6798;
  this->builder = b;
  pNVar1 = b->nfcImpl;
  (this->builderData).trie = (UTrie2 *)0x0;
  (this->builderData).ce32s = (uint32_t *)0x0;
  (this->builderData).ces = (int64_t *)0x0;
  (this->builderData).contexts = (UChar *)0x0;
  (this->builderData).base = (CollationData *)0x0;
  (this->builderData).jamoCE32s = (uint32_t *)0x0;
  (this->builderData).nfcImpl = pNVar1;
  (this->builderData).numericPrimary = 0x12000000;
  (this->builderData).rootElements = (uint32_t *)0x0;
  (this->builderData).rootElementsLength = 0;
  *(undefined8 *)((long)&(this->builderData).scriptsIndex + 4) = 0;
  *(undefined8 *)((long)&(this->builderData).scriptStarts + 4) = 0;
  *(undefined8 *)((long)&(this->builderData).fastLatinTable + 4) = 0;
  *(undefined8 *)&(this->builderData).numScripts = 0;
  *(undefined8 *)((long)&(this->builderData).compressibleBytes + 4) = 0;
  *(undefined8 *)((long)&(this->builderData).unsafeBackwardSet + 4) = 0;
  (this->builderData).ce32sLength = 0;
  (this->builderData).cesLength = 0;
  *(undefined8 *)&(this->builderData).contextsLength = 0;
  this->s = (UnicodeString *)0x0;
  this->pos = 0;
  (this->builderData).base = b->base;
  auVar2 = _DAT_002edd80;
  auVar5 = _DAT_002edd70;
  do {
    bVar7 = SUB164(auVar5 ^ auVar2,4) == -0x80000000 && SUB164(auVar5 ^ auVar2,0) < -0x7fffffbd;
    if (bVar7) {
      iVar4 = 0x1180;
      if (uVar3 < 0x28) {
        iVar4 = 0x114e;
      }
      if (uVar3 < 0x13) {
        iVar4 = 0x1100;
      }
      this->jamoCE32s[uVar3] = (iVar4 + (int)uVar3) * 0x2000 | 0x1c7;
    }
    if (bVar7) {
      iVar4 = 0x1180;
      if (uVar3 < 0x28) {
        iVar4 = 0x114e;
      }
      if (uVar3 + 1 < 0x13) {
        iVar4 = 0x1100;
      }
      this->jamoCE32s[uVar3 + 1] = (iVar4 + (int)uVar3) * 0x2000 + 0x21c7;
    }
    uVar3 = uVar3 + 2;
    lVar6 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 2;
    auVar5._8_8_ = lVar6 + 2;
  } while (uVar3 != 0x44);
  (this->builderData).jamoCE32s = this->jamoCE32s;
  return;
}

Assistant:

DataBuilderCollationIterator::DataBuilderCollationIterator(CollationDataBuilder &b)
        : CollationIterator(&builderData, /*numeric=*/ FALSE),
          builder(b), builderData(b.nfcImpl),
          s(NULL), pos(0) {
    builderData.base = builder.base;
    // Set all of the jamoCE32s[] to indirection CE32s.
    for(int32_t j = 0; j < CollationData::JAMO_CE32S_LENGTH; ++j) {  // Count across Jamo types.
        UChar32 jamo = CollationDataBuilder::jamoCpFromIndex(j);
        jamoCE32s[j] = Collation::makeCE32FromTagAndIndex(Collation::BUILDER_DATA_TAG, jamo) |
                CollationDataBuilder::IS_BUILDER_JAMO_CE32;
    }
    builderData.jamoCE32s = jamoCE32s;
}